

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstring.cpp
# Opt level: O2

void __thiscall FString::Insert(FString *this,size_t index,char *instr,size_t instrlen)

{
  char *__src;
  char *pcVar1;
  ulong uVar2;
  size_t __n;
  FStringData *old;
  
  if (instrlen == 0) {
    return;
  }
  __src = this->Chars;
  uVar2 = (ulong)*(uint *)(__src + -0xc);
  __n = uVar2 - index;
  if (index <= uVar2 && __n != 0) {
    if (*(int *)(__src + -4) < 2) {
      ReallocBuffer(this,uVar2 + instrlen);
      memmove(this->Chars + index + instrlen,this->Chars + index,__n + 1);
      memcpy(this->Chars + index,instr,instrlen);
      return;
    }
    AllocBuffer(this,uVar2 + instrlen);
    pcVar1 = this->Chars;
    memcpy(pcVar1,__src,index);
    pcVar1[index] = '\0';
    pcVar1 = this->Chars;
    memcpy(pcVar1 + index,instr,instrlen);
    (pcVar1 + index)[instrlen] = '\0';
    pcVar1 = this->Chars;
    memcpy(pcVar1 + instrlen + index,__src + index,__n);
    (pcVar1 + instrlen + index)[__n] = '\0';
    FStringData::Release((FStringData *)(__src + -0xc));
    return;
  }
  AppendCStrPart(this,instr,instrlen);
  return;
}

Assistant:

void FString::Insert (size_t index, const char *instr, size_t instrlen)
{
	if (instrlen > 0)
	{
		size_t mylen = Len();
		if (index >= mylen)
		{
			AppendCStrPart(instr, instrlen);
		}
		else if (Data()->RefCount <= 1)
		{
			ReallocBuffer(mylen + instrlen);
			memmove(Chars + index + instrlen, Chars + index, (mylen - index + 1) * sizeof(char));
			memcpy(Chars + index, instr, instrlen * sizeof(char));
		}
		else
		{
			FStringData *old = Data();
			AllocBuffer(mylen + instrlen);
			StrCopy(Chars, old->Chars(), index);
			StrCopy(Chars + index, instr, instrlen);
			StrCopy(Chars + index + instrlen, old->Chars() + index, mylen - index);
			old->Release();
		}
	}
}